

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int arena_i_reset_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  int iVar1;
  uint arena_ind;
  arena_t *arena;
  uint *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  arena_t *local_20;
  
  iVar1 = arena_i_reset_destroy_helper
                    ((tsd_t *)mib,(size_t *)oldp,(size_t)oldlenp,newp,(size_t *)newlen,
                     &stack0xffffffffffffffdc,(size_t)&local_20,in_stack_ffffffffffffffd0,
                     (arena_t **)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (iVar1 == 0) {
    arena_reset_prepare_background_thread(tsd,in_stack_ffffffffffffffdc);
    duckdb_je_arena_reset(tsd,local_20);
    arena_reset_finish_background_thread(tsd,in_stack_ffffffffffffffdc);
  }
  return iVar1;
}

Assistant:

static int
arena_i_reset_ctl(tsd_t *tsd, const size_t *mib, size_t miblen, void *oldp,
    size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned arena_ind;
	arena_t *arena;

	ret = arena_i_reset_destroy_helper(tsd, mib, miblen, oldp, oldlenp,
	    newp, newlen, &arena_ind, &arena);
	if (ret != 0) {
		return ret;
	}

	arena_reset_prepare_background_thread(tsd, arena_ind);
	arena_reset(tsd, arena);
	arena_reset_finish_background_thread(tsd, arena_ind);

	return ret;
}